

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-tx.cpp
# Opt level: O2

void MutateTx(CMutableTransaction *tx,string *command,string *commandVal)

{
  byte bVar1;
  long lVar2;
  pointer pCVar3;
  undefined4 uVar4;
  CScript scriptPubKeyIn;
  Txid hashPrevTx;
  CScript scriptPubKeyIn_00;
  CScript scriptPubKeyIn_01;
  CScript scriptPubKeyIn_02;
  CScript scriptPubKeyIn_03;
  CScript scriptSigIn;
  undefined8 uVar5;
  pointer pbVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint32_t uVar11;
  reference pvVar12;
  ECC_Context *pEVar13;
  size_type sVar14;
  size_type sVar15;
  ulong uVar16;
  CScript *pCVar17;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  byte *pbVar18;
  FILE *__stream;
  size_t sVar19;
  size_type sVar20;
  mapped_type *pmVar21;
  UniValue *pUVar22;
  UniValue *pUVar23;
  string *psVar24;
  Coin *pCVar25;
  CTxOut *txout;
  runtime_error *prVar26;
  long lVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  CTxIn *pCVar28;
  string *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char sep;
  uint *in_R8;
  pointer pCVar29;
  undefined **ppuVar30;
  long lVar31;
  CTxIn *txin;
  pointer pCVar32;
  long in_FS_OFFSET;
  bool bVar33;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view val;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view hex;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>
  __l;
  string_view hex_00;
  Span<const_unsigned_char> s;
  undefined8 in_stack_ffffffffffffea78;
  undefined8 in_stack_ffffffffffffea80;
  undefined8 in_stack_ffffffffffffea88;
  undefined8 in_stack_ffffffffffffea90;
  undefined4 uStack_1568;
  undefined4 local_1564;
  undefined8 local_1560;
  undefined4 local_1558;
  undefined4 uStack_1554;
  unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> ecc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pkData;
  CCoinsView viewDummy;
  CMutableTransaction txv;
  CAmount value;
  pointer local_14e8;
  pointer local_14d8;
  pointer local_14d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStrInputParts_1;
  string local_1468;
  string local_1448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rsData;
  CScript redeemScript;
  COutPoint out;
  CScript scriptPubKey_1;
  optional<transaction_identifier<false>_> txid_1;
  int64_t vout;
  undefined1 uStack_1350;
  undefined1 uStack_134f;
  undefined1 uStack_134e;
  undefined1 uStack_134d;
  undefined1 uStack_134c;
  undefined1 uStack_134b;
  undefined1 uStack_134a;
  undefined1 uStack_1349;
  undefined1 local_1348 [48];
  pointer local_1318;
  pointer local_1310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStrInputParts;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_12e0 [2];
  pointer local_12b8;
  pointer local_12b0;
  uint32_t newVersion;
  undefined4 uStack_1294;
  undefined8 uStack_1290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1270;
  size_t local_1268;
  _Rb_tree_node_base local_1258;
  size_t local_1238;
  __native_type _Stack_1230;
  optional<transaction_identifier<false>_> txid;
  CTxIn txin_1;
  pointer local_fd0;
  pointer local_fc8;
  
  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ecc._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
  super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
  super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
       (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)
       (__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>)0x0;
  bVar7 = std::operator==(command,"nversion");
  if (bVar7) {
    str._M_str = (commandVal->_M_dataplus)._M_p;
    str._M_len = commandVal->_M_string_length;
    bVar7 = ParseUInt32(str,&newVersion);
    if (!bVar7 || 2 < newVersion - 1) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txid,
                     "Invalid TX version requested: \'",commandVal);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txin_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txid,"\'"
                    );
      std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00115073;
    }
    tx->version = newVersion;
  }
  else {
    bVar7 = std::operator==(command,"locktime");
    if (bVar7) {
      str_00._M_str = (commandVal->_M_dataplus)._M_p;
      str_00._M_len = commandVal->_M_string_length;
      bVar7 = ParseInt64(str_00,(int64_t *)&newVersion);
      if ((ulong)_newVersion >> 0x20 != 0 || !bVar7) {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txid,
                       "Invalid TX locktime requested: \'",commandVal);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txin_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txid,
                       "\'");
        std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00115073;
      }
      tx->nLockTime = (uint32_t)_newVersion;
    }
    else {
      bVar7 = std::operator==(command,"replaceable");
      if (bVar7) {
        _newVersion = (undefined **)0xffffffffffffffff;
        bVar7 = std::operator==(commandVal,"");
        if (!bVar7) {
          str_02._M_str = (commandVal->_M_dataplus)._M_p;
          str_02._M_len = commandVal->_M_string_length;
          bVar7 = ParseInt64(str_02,(int64_t *)&newVersion);
          if (bVar7 && -1 < (long)_newVersion) {
            pCVar32 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pCVar29 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if ((long)_newVersion < ((long)pCVar29 - (long)pCVar32) / 0x68) goto LAB_00111816;
          }
          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txid,
                         "Invalid TX input index \'",commandVal);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &txin_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&txid,"\'");
          std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00115073;
        }
        pCVar32 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar29 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish;
LAB_00111816:
        ppuVar30 = (undefined **)0x0;
        for (; pCVar32 != pCVar29; pCVar32 = pCVar32 + 1) {
          bVar7 = std::operator==(commandVal,"");
          if (((bVar7) || (ppuVar30 == _newVersion)) && (0xfffffffd < pCVar32->nSequence)) {
            pCVar32->nSequence = 0xfffffffd;
          }
          ppuVar30 = (undefined **)((long)ppuVar30 + 1);
        }
      }
      else {
        bVar7 = std::operator==(command,"delin");
        if (bVar7) {
          str_01._M_str = (commandVal->_M_dataplus)._M_p;
          str_01._M_len = commandVal->_M_string_length;
          bVar7 = ParseInt64(str_01,(int64_t *)&newVersion);
          if ((!bVar7 || (long)_newVersion < 0) ||
             (pCVar32 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start,
             ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pCVar32) / 0x68 <= (long)_newVersion))
          {
            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &txid,"Invalid TX input index \'",commandVal);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &txin_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&txid,"\'");
            std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00115073;
          }
          std::vector<CTxIn,_std::allocator<CTxIn>_>::erase(&tx->vin,pCVar32 + (long)_newVersion);
        }
        else {
          bVar7 = std::operator==(command,"in");
          if (bVar7) {
            str_06._M_str = (char *)0x3a;
            str_06._M_len = (size_t)(commandVal->_M_dataplus)._M_p;
            util::SplitString_abi_cxx11_
                      (&vStrInputParts,(util *)commandVal->_M_string_length,str_06,(char)in_R8);
            if ((ulong)((long)vStrInputParts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vStrInputParts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar26,"TX input missing separator");
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_00115073;
            }
            hex._M_str = ((vStrInputParts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
            hex._M_len = (vStrInputParts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
            transaction_identifier<false>::FromHex(&txid,hex);
            pbVar6 = vStrInputParts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                super__Optional_payload_base<transaction_identifier<false>_>._M_engaged == false) {
              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar26,"invalid TX input txid");
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_00115073;
            }
            str_03._M_str =
                 vStrInputParts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
            str_03._M_len =
                 vStrInputParts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
            bVar7 = ParseInt64(str_03,&vout);
            if (!bVar7 || 0x1b207 < (ulong)vout) {
              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &newVersion,"invalid TX input vout \'",pbVar6 + 1);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &txin_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&newVersion,"\'");
              std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_00115073;
            }
            if (0x40 < (ulong)((long)vStrInputParts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)vStrInputParts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              pvVar12 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::at(&vStrInputParts,2);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&txin_1,"invalid TX sequence id",(allocator<char> *)&newVersion);
              TrimAndParse<unsigned_int>(pvVar12,(string *)&txin_1);
              std::__cxx11::string::~string((string *)&txin_1);
            }
            _newVersion = (undefined **)0x0;
            uStack_1290 = 0;
            local_1288._M_allocated_capacity = 0;
            local_1288._8_8_ = 0;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._1_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._2_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._3_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._4_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._5_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._6_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._7_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._M_value.
                 m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._28_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._29_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._30_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._31_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._24_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._25_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._26_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._27_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._8_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._9_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._10_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._11_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._12_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._13_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._14_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._15_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._16_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._17_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._18_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._19_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._20_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._21_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._22_1_;
            hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                 txid.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                 super__Optional_payload_base<transaction_identifier<false>_>._M_payload._23_1_;
            scriptSigIn.super_CScriptBase._union._4_4_ = local_1564;
            scriptSigIn.super_CScriptBase._union._0_4_ = uStack_1568;
            scriptSigIn.super_CScriptBase._union._8_8_ = local_1560;
            scriptSigIn.super_CScriptBase._union._16_4_ = local_1558;
            scriptSigIn.super_CScriptBase._union._20_4_ = uStack_1554;
            scriptSigIn.super_CScriptBase._24_8_ =
                 ecc._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t
                 .super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
                 super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl;
            CTxIn::CTxIn(&txin_1,hashPrevTx,(uint32_t)vout,scriptSigIn,(uint32_t)&newVersion);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back(&tx->vin,&txin_1);
            CTxIn::~CTxIn(&txin_1);
            this_00 = &vStrInputParts;
            goto LAB_00111b97;
          }
          bVar7 = std::operator==(command,"delout");
          if (bVar7) {
            str_04._M_str = (commandVal->_M_dataplus)._M_p;
            str_04._M_len = commandVal->_M_string_length;
            bVar7 = ParseInt64(str_04,(int64_t *)&newVersion);
            if ((!bVar7 || (long)_newVersion < 0) ||
               (pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_start,
               ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar3) / 0x28 <= (long)_newVersion)
               ) {
              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &txid,"Invalid TX output index \'",commandVal);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &txin_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&txid,"\'");
              std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_00115073;
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::erase
                      (&tx->vout,pCVar3 + (long)_newVersion);
          }
          else {
            bVar7 = std::operator==(command,"outaddr");
            if (bVar7) {
              str_07._M_str = (char *)0x3a;
              str_07._M_len = (size_t)(commandVal->_M_dataplus)._M_p;
              util::SplitString_abi_cxx11_
                        (&vStrInputParts_1,(util *)commandVal->_M_string_length,str_07,(char)in_R8);
              if ((long)vStrInputParts_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vStrInputParts_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x40) {
                prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar26,"TX output missing or too many separators");
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                  __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_00115073;
              }
              value = ExtractAndValidateValue
                                (vStrInputParts_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              std::__cxx11::string::string
                        ((string *)&newVersion,
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
              DecodeDestination((CTxDestination *)&txin_1,(string *)&newVersion);
              bVar7 = IsValidDestination((CTxDestination *)&txin_1);
              if (!bVar7) {
                prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar26,"invalid TX output address");
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                  __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_00115073;
              }
              GetScriptForDestination((CScript *)&vStrInputParts,(CTxDestination *)&txin_1);
              prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vout,
                         (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts);
              scriptPubKeyIn.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffea80;
              scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
                   (char *)in_stack_ffffffffffffea78;
              scriptPubKeyIn.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffea88;
              scriptPubKeyIn.super_CScriptBase._24_8_ = in_stack_ffffffffffffea90;
              CTxOut::CTxOut((CTxOut *)&txid,&value,scriptPubKeyIn);
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vout);
              std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back(&tx->vout,(value_type *)&txid)
              ;
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         ((long)&txid.
                                 super__Optional_base<transaction_identifier<false>,_true,_true>.
                                 _M_payload.
                                 super__Optional_payload_base<transaction_identifier<false>_>.
                                 _M_payload._M_value.m_wrapped.super_base_blob<256U> + 8));
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts);
              std::__detail::__variant::
              _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                   *)&txin_1);
              this = (string *)&newVersion;
LAB_00111b19:
              std::__cxx11::string::~string(this);
              this_00 = &vStrInputParts_1;
            }
            else {
              bVar7 = std::operator==(command,"outpubkey");
              if (bVar7) {
                pEVar13 = (ECC_Context *)operator_new(1);
                sep = (char)in_R8;
                ECC_Context::ECC_Context(pEVar13);
                std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
                          ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)&ecc,
                           pEVar13);
                str_08._M_str = (char *)0x3a;
                str_08._M_len = (size_t)(commandVal->_M_dataplus)._M_p;
                util::SplitString_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&vout,(util *)commandVal->_M_string_length,str_08,sep);
                if ((_uStack_1350 - vout & 0xffffffffffffffc0U) != 0x40) {
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar26,"TX output missing or too many separators");
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_00115073;
                }
                value = ExtractAndValidateValue((string *)vout);
                hex_str._M_str = *(char **)(vout + 0x20);
                hex_str._M_len = *(size_t *)(vout + 0x28);
                ParseHex<unsigned_char>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txin_1,hex_str)
                ;
                CPubKey::Set<unsigned_char_const*>
                          ((CPubKey *)&txid,
                           (uchar *)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
                                    _M_elems._0_8_,
                           (uchar *)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
                                    _M_elems._8_8_);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txin_1);
                bVar7 = CPubKey::IsFullyValid((CPubKey *)&txid);
                if (!bVar7) {
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar26,"invalid TX output pubkey");
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_00115073;
                }
                GetScriptForRawPubKey((CScript *)&newVersion,(CPubKey *)&txid);
                if (_uStack_1350 - vout == 0x60) {
                  std::__cxx11::string::string
                            ((string *)&txin_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (vout + 0x40));
                  sVar14 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&txin_1,'W',0);
                  sVar15 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&txin_1,'S',0);
                  std::__cxx11::string::~string((string *)&txin_1);
                  if (sVar14 != 0xffffffffffffffff) {
                    if ((txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                         _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                         _M_payload._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] &
                        0xfe) != 2) {
                      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar26,"Uncompressed pubkeys are not useable for SegWit outputs");
                      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                        __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_00115073;
                    }
                    WitnessV0KeyHash::WitnessV0KeyHash
                              ((WitnessV0KeyHash *)&vStrInputParts_1,(CPubKey *)&txid);
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    txin_1.nSequence._0_1_ = 5;
                    GetScriptForDestination((CScript *)&vStrInputParts,(CTxDestination *)&txin_1);
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion,
                               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts);
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts);
                    std::__detail::__variant::
                    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                         *)&txin_1);
                  }
                  if (sVar15 != 0xffffffffffffffff) {
                    ScriptHash::ScriptHash((ScriptHash *)&vStrInputParts_1,(CScript *)&newVersion);
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
                         vStrInputParts_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    txin_1.nSequence._0_1_ = 3;
                    GetScriptForDestination((CScript *)&vStrInputParts,(CTxDestination *)&txin_1);
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion,
                               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts);
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts);
                    std::__detail::__variant::
                    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                         *)&txin_1);
                  }
                }
                prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts,
                           (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                scriptPubKeyIn_00.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffea80;
                scriptPubKeyIn_00.super_CScriptBase._union.indirect_contents.indirect =
                     (char *)in_stack_ffffffffffffea78;
                scriptPubKeyIn_00.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffea88;
                scriptPubKeyIn_00.super_CScriptBase._24_8_ = in_stack_ffffffffffffea90;
                CTxOut::CTxOut((CTxOut *)&txin_1,&value,scriptPubKeyIn_00);
                prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts);
                std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                          (&tx->vout,(value_type *)&txin_1);
                prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           ((long)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
                                  _M_elems + 8));
                prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&vout;
              }
              else {
                bVar7 = std::operator==(command,"outmultisig");
                if (!bVar7) {
                  bVar7 = std::operator==(command,"outscript");
                  if (!bVar7) {
                    bVar7 = std::operator==(command,"outdata");
                    if (!bVar7) {
                      bVar7 = std::operator==(command,"sign");
                      if (bVar7) {
                        pEVar13 = (ECC_Context *)operator_new(1);
                        ECC_Context::ECC_Context(pEVar13);
                        std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
                                  ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>
                                    *)&ecc,pEVar13);
                        if (commandVal->_M_string_length == 0) {
                          uVar8 = 1;
                        }
                        else {
                          lVar31 = 0;
                          do {
                            lVar27 = lVar31;
                            if (lVar27 + 0x10 == 0x80) {
                              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        (prVar26,"unknown sighash flag/sign option");
                              goto LAB_001139fd;
                            }
                            bVar7 = std::operator==(commandVal,
                                                    *(char **)((long)&sighashOptions[0].flagStr +
                                                              lVar27));
                            lVar31 = lVar27 + 0x10;
                          } while (!bVar7);
                          uVar8 = *(uint *)((long)&sighashOptions[0].flags + lVar27);
                        }
                        CMutableTransaction::CMutableTransaction((CMutableTransaction *)&value,tx);
                        CMutableTransaction::CMutableTransaction(&txv,tx);
                        viewDummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_003be318;
                        CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&txid,&viewDummy,false);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&txin_1,"privatekeys",(allocator<char> *)&newVersion);
                        sVar20 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                 ::count(&registers_abi_cxx11_,(key_type *)&txin_1);
                        std::__cxx11::string::~string((string *)&txin_1);
                        if (sVar20 == 0) {
                          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar26,"privatekeys register variable must be set.");
                          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                            __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          goto LAB_00115073;
                        }
                        local_1278 = &local_1288;
                        _newVersion = &PTR__FillableSigningProvider_003bf878;
                        local_1288._M_allocated_capacity =
                             local_1288._M_allocated_capacity & 0xffffffff00000000;
                        local_1288._8_8_ = 0;
                        local_1268 = 0;
                        local_1258._M_left = &local_1258;
                        local_1258._M_color = _S_red;
                        local_1258._M_parent = (_Base_ptr)0x0;
                        _Stack_1230._8_8_ = 0;
                        local_1238 = 0;
                        _Stack_1230.__align = 0;
                        _Stack_1230.__data.__list.__prev = (__pthread_internal_list *)0x0;
                        _Stack_1230.__data.__list.__next = (__pthread_internal_list *)0x0;
                        _Stack_1230._16_8_ = 1;
                        local_1270 = local_1278;
                        local_1258._M_right = local_1258._M_left;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&txin_1,"privatekeys",(allocator<char> *)&vout);
                        pmVar21 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                  ::operator[](&registers_abi_cxx11_,(key_type *)&txin_1);
                        UniValue::UniValue((UniValue *)&vStrInputParts,pmVar21);
                        std::__cxx11::string::~string((string *)&txin_1);
                        for (uVar9 = 0; uVar16 = (ulong)uVar9,
                            uVar16 < (ulong)(((long)local_12b0 - (long)local_12b8) / 0x58);
                            uVar9 = uVar9 + 1) {
                          pUVar22 = UniValue::operator[]((UniValue *)&vStrInputParts,uVar16);
                          if (pUVar22->typ != VSTR) {
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar26,"privatekey not a std::string");
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          UniValue::operator[]((UniValue *)&vStrInputParts,uVar16);
                          DecodeSecret((string *)&txin_1);
                          if (txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                              _8_8_ == 0) {
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error(prVar26,"privatekey not valid");
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          FillableSigningProvider::AddKey
                                    ((FillableSigningProvider *)&newVersion,(CKey *)&txin_1);
                          std::
                          unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                         *)((long)txin_1.prevout.hash.m_wrapped.
                                                  super_base_blob<256U>.m_data._M_elems + 8));
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&txin_1,"prevtxs",(allocator<char> *)&vout);
                        sVar20 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                 ::count(&registers_abi_cxx11_,(key_type *)&txin_1);
                        std::__cxx11::string::~string((string *)&txin_1);
                        if (sVar20 == 0) {
                          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar26,"prevtxs register variable must be set.");
                          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                            __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          goto LAB_00115073;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&txin_1,"prevtxs",(allocator<char> *)&vStrInputParts_1)
                        ;
                        pmVar21 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                                  ::operator[](&registers_abi_cxx11_,(key_type *)&txin_1);
                        UniValue::UniValue((UniValue *)&vout,pmVar21);
                        std::__cxx11::string::~string((string *)&txin_1);
                        for (uVar9 = 0;
                            (ulong)uVar9 < (ulong)(((long)local_1310 - (long)local_1318) / 0x58);
                            uVar9 = uVar9 + 1) {
                          pUVar22 = UniValue::operator[]((UniValue *)&vout,(ulong)uVar9);
                          if (pUVar22->typ != VOBJ) {
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar26,"expected prevtxs internal object");
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\x03';
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
                          std::
                          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>
                          ::pair<const_char_(&)[5],_UniValue::VType,_true>
                                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>
                                      *)&txin_1,(char (*) [5])0x221ef9,(VType *)&out);
                          txid_1.super__Optional_base<transaction_identifier<false>,_true,_true>.
                          _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                          _M_payload._0_4_ = 4;
                          std::
                          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>
                          ::pair<const_char_(&)[5],_UniValue::VType,_true>
                                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>
                                      *)&txin_1.scriptSig,(char (*) [5])0x22456d,(VType *)&txid_1);
                          scriptPubKey_1.super_CScriptBase._union._0_4_ = 3;
                          std::
                          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>
                          ::pair<const_char_(&)[13],_UniValue::VType,_true>
                                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>
                                      *)&txin_1.scriptWitness,(char (*) [13])"scriptPubKey",
                                     (VType *)&scriptPubKey_1);
                          __l._M_len = 3;
                          __l._M_array = (iterator)&txin_1;
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                                 *)&vStrInputParts_1,__l,
                                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&redeemScript,(allocator_type *)&rsData);
                          lVar31 = 0x50;
                          do {
                            std::__cxx11::string::~string
                                      ((string *)
                                       ((long)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.
                                              m_data._M_elems + lVar31));
                            lVar31 = lVar31 + -0x28;
                          } while (lVar31 != -0x28);
                          bVar7 = UniValue::checkObject
                                            (pUVar22,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                                                  *)&vStrInputParts_1);
                          if (!bVar7) {
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      (prVar26,"prevtxs internal object typecheck fail");
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&txin_1,"txid",(allocator<char> *)&out);
                          pUVar23 = UniValue::operator[](pUVar22,(string *)&txin_1);
                          psVar24 = UniValue::get_str_abi_cxx11_(pUVar23);
                          hex_00._M_str = (psVar24->_M_dataplus)._M_p;
                          hex_00._M_len = psVar24->_M_string_length;
                          transaction_identifier<false>::FromHex(&txid_1,hex_00);
                          std::__cxx11::string::~string((string *)&txin_1);
                          if (txid_1.super__Optional_base<transaction_identifier<false>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<transaction_identifier<false>_>.
                              _M_engaged == false) {
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&scriptPubKey_1,"txid",
                                       (allocator<char> *)&redeemScript);
                            pUVar22 = UniValue::operator[](pUVar22,(string *)&scriptPubKey_1);
                            psVar24 = UniValue::get_str_abi_cxx11_(pUVar22);
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&out,"txid must be hexadecimal string (not \'",psVar24
                                          );
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&txin_1,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&out,"\')");
                            std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&txin_1,"vout",(allocator<char> *)&out);
                          pUVar23 = UniValue::operator[](pUVar22,(string *)&txin_1);
                          uVar11 = UniValue::getInt<int>(pUVar23);
                          std::__cxx11::string::~string((string *)&txin_1);
                          if ((int)uVar11 < 0) {
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error(prVar26,"vout cannot be negative");
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._4_4_ =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._4_4_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_ =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._0_4_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._16_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._17_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._18_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._19_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._20_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._21_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._22_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._23_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._24_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._25_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._26_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._27_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._28_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._29_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._30_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._31_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._8_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._9_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._10_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._11_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._12_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._13_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._14_1_;
                          out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                               txid_1.
                               super__Optional_base<transaction_identifier<false>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<transaction_identifier<false>_>.
                               _M_payload._15_1_;
                          out.n = uVar11;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&txin_1,"scriptPubKey",
                                     (allocator<char> *)&redeemScript);
                          pUVar23 = UniValue::operator[](pUVar22,(string *)&txin_1);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&scriptPubKey_1,"scriptPubKey",
                                     (allocator<char> *)&rsData);
                          ParseHexUV(&pkData,pUVar23,(string *)&scriptPubKey_1);
                          std::__cxx11::string::~string((string *)&scriptPubKey_1);
                          std::__cxx11::string::~string((string *)&txin_1);
                          prevector<28U,_unsigned_char,_unsigned_int,_int>::
                          prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                     &scriptPubKey_1,
                                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      )pkData.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      )pkData.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
                          pCVar25 = CCoinsViewCache::AccessCoin((CCoinsViewCache *)&txid,&out);
                          if ((pCVar25->out).nValue != -1) {
                            pCVar17 = &(pCVar25->out).scriptPubKey;
                            bVar7 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                                              (&pCVar17->super_CScriptBase,
                                               &scriptPubKey_1.super_CScriptBase);
                            if (bVar7) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&txin_1,
                                         "Previous output scriptPubKey mismatch:\n",
                                         (allocator<char> *)&redeemScript);
                              ScriptToAsmStr_abi_cxx11_(&local_1448,pCVar17,false);
                              std::operator+(&local_1428,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&txin_1,&local_1448);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&rsData,&local_1428,"\nvs:\n");
                              ScriptToAsmStr_abi_cxx11_(&local_1468,&scriptPubKey_1,false);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&redeemScript,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&rsData,&local_1468);
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&txin_1,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&redeemScript);
                              std::__cxx11::string::~string((string *)&redeemScript);
                              std::__cxx11::string::~string((string *)&local_1468);
                              std::__cxx11::string::~string((string *)&rsData);
                              std::__cxx11::string::~string((string *)&local_1428);
                              std::__cxx11::string::~string((string *)&local_1448);
                              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
                              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                                __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              goto LAB_00115073;
                            }
                          }
                          Coin::Coin((Coin *)&txin_1);
                          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                     ((long)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.
                                            m_data._M_elems + 8),&scriptPubKey_1.super_CScriptBase);
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
                               '\0';
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                               '@';
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                               '\a';
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                               'Z';
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
                               0xf0;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
                               'u';
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
                               '\a';
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
                               '\0';
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&redeemScript,"amount",(allocator<char> *)&rsData);
                          bVar7 = UniValue::exists(pUVar22,(string *)&redeemScript);
                          std::__cxx11::string::~string((string *)&redeemScript);
                          if (bVar7) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&redeemScript,"amount",
                                       (allocator<char> *)&local_1428);
                            pUVar23 = UniValue::operator[](pUVar22,(string *)&redeemScript);
                            if (pUVar23->typ - VSTR < 2) {
                              val._M_str = (pUVar23->val)._M_dataplus._M_p;
                              val._M_len = (pUVar23->val)._M_string_length;
                              bVar7 = ParseFixedPoint(val,8,(int64_t *)&rsData);
                              if (bVar7) {
                                if (rsData.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start <
                                    (pointer)0x775f05a074001) {
                                  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
                                  _M_elems._0_8_ =
                                       rsData.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                                  std::__cxx11::string::~string((string *)&redeemScript);
                                  goto LAB_00113017;
                                }
                                prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(prVar26,"Amount out of range");
                              }
                              else {
                                prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error(prVar26,"Invalid amount");
                              }
                            }
                            else {
                              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        (prVar26,"Amount is not a number or string");
                            }
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
LAB_00113017:
                          txin_1.scriptSig.super_CScriptBase._union._0_4_ =
                               txin_1.scriptSig.super_CScriptBase._union._0_4_ & 1 | 2;
                          CCoinsViewCache::AddCoin
                                    ((CCoinsViewCache *)&txid,&out,(Coin *)&txin_1,true);
                          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                     ((long)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.
                                            m_data._M_elems + 8));
                          bVar7 = CScript::IsPayToScriptHash(&scriptPubKey_1);
                          if ((bVar7) ||
                             (bVar7 = CScript::IsPayToWitnessScriptHash(&scriptPubKey_1), bVar7)) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&txin_1,"redeemScript",
                                       (allocator<char> *)&redeemScript);
                            bVar7 = UniValue::exists(pUVar22,(string *)&txin_1);
                            std::__cxx11::string::~string((string *)&txin_1);
                            if (bVar7) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&redeemScript,"redeemScript",
                                         (allocator<char> *)&rsData);
                              pUVar22 = UniValue::operator[](pUVar22,(string *)&redeemScript);
                              UniValue::UniValue((UniValue *)&txin_1,pUVar22);
                              std::__cxx11::string::~string((string *)&redeemScript);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&redeemScript,"redeemScript",
                                         (allocator<char> *)&local_1428);
                              ParseHexUV(&rsData,(UniValue *)&txin_1,(string *)&redeemScript);
                              std::__cxx11::string::~string((string *)&redeemScript);
                              prevector<28U,_unsigned_char,_unsigned_int,_int>::
                              prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                         &redeemScript,
                                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          )rsData.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          )rsData.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                              FillableSigningProvider::AddCScript
                                        ((FillableSigningProvider *)&newVersion,&redeemScript);
                              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                         &redeemScript);
                              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                              ~_Vector_base(&rsData.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           );
                              UniValue::~UniValue((UniValue *)&txin_1);
                            }
                          }
                          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                    (&scriptPubKey_1.super_CScriptBase);
                          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                          ~_Vector_base(&pkData.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       );
                          std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
                                       *)&vStrInputParts_1);
                        }
                        for (uVar9 = 0; uVar16 = (ulong)uVar9,
                            uVar16 < (ulong)(((long)local_14e8 - value) / 0x68); uVar9 = uVar9 + 1)
                        {
                          pCVar28 = (CTxIn *)(value + uVar16 * 0x68);
                          txout = &CCoinsViewCache::AccessCoin
                                             ((CCoinsViewCache *)&txid,(COutPoint *)pCVar28)->out;
                          if (txout->nValue != -1) {
                            DataFromTransaction((SignatureData *)&txin_1,
                                                (CMutableTransaction *)&value,uVar9,txout);
                            if (((uVar8 & 0xffffff7f) != 3) ||
                               (uVar16 < (ulong)(((long)local_14d0 - (long)local_14d8) / 0x28))) {
                              MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                                        ((MutableTransactionSignatureCreator *)&vStrInputParts_1,
                                         (CMutableTransaction *)&value,uVar9,&txout->nValue,uVar8);
                              ProduceSignature((SigningProvider *)&newVersion,
                                               (BaseSignatureCreator *)&vStrInputParts_1,
                                               &txout->scriptPubKey,(SignatureData *)&txin_1);
                            }
                            if ((txout->nValue == 2100000000000000) && (local_fd0 != local_fc8)) {
                              prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                              uVar8 = (txout->scriptPubKey).super_CScriptBase._size;
                              args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(ulong)uVar8;
                              uVar9 = uVar8 - 0x1d;
                              pCVar17 = (CScript *)
                                        (txout->scriptPubKey).super_CScriptBase._union.
                                        indirect_contents.indirect;
                              if (uVar8 < 0x1d) {
                                uVar9 = uVar8;
                                pCVar17 = &txout->scriptPubKey;
                              }
                              s.m_size._0_4_ = uVar9;
                              s.m_data = (uchar *)pCVar17;
                              s.m_size._4_4_ = 0;
                              HexStr_abi_cxx11_((string *)&out,s);
                              tinyformat::format<std::__cxx11::string>
                                        ((string *)&vStrInputParts_1,
                                         (tinyformat *)
                                         "Missing amount for CTxOut with scriptPubKey=%s",
                                         (char *)&out,args);
                              std::runtime_error::runtime_error(prVar26,(string *)&vStrInputParts_1)
                              ;
                              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                                __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              goto LAB_00115073;
                            }
                            UpdateInput(pCVar28,(SignatureData *)&txin_1);
                            SignatureData::~SignatureData((SignatureData *)&txin_1);
                          }
                        }
                        CMutableTransaction::operator=(tx,(CMutableTransaction *)&value);
                        UniValue::~UniValue((UniValue *)&vout);
                        UniValue::~UniValue((UniValue *)&vStrInputParts);
                        FillableSigningProvider::~FillableSigningProvider
                                  ((FillableSigningProvider *)&newVersion);
                        CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)&txid);
                        CMutableTransaction::~CMutableTransaction(&txv);
                        CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&value);
                        goto LAB_001116ee;
                      }
                      bVar7 = std::operator==(command,"load");
                      if (bVar7) {
                        sVar14 = std::__cxx11::
                                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                 find(commandVal,':',0);
                        if ((1 < sVar14 + 1) && (sVar14 != commandVal->_M_string_length - 1)) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&txid,commandVal,0,sVar14);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&newVersion,commandVal,sVar14 + 1,0xffffffffffffffff);
                          fs::path::path((path *)&txin_1,(char *)_newVersion);
                          __stream = fsbridge::fopen((char *)&txin_1,"r");
                          std::filesystem::__cxx11::path::~path((path *)&txin_1);
                          if (__stream == (FILE *)0x0) {
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&txin_1,"Cannot open file ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&newVersion);
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          vStrInputParts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               (pointer)&vStrInputParts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          vStrInputParts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          vStrInputParts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (pointer)((ulong)vStrInputParts.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                        0xffffffffffffff00);
                          while ((iVar10 = feof(__stream), iVar10 == 0 &&
                                 (iVar10 = ferror(__stream), iVar10 == 0))) {
                            sVar19 = fread(&txin_1,1,0x1000,__stream);
                            if ((int)(uint)sVar19 < 1) break;
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&vStrInputParts,
                                   (size_type)
                                   vStrInputParts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,(char *)&txin_1,
                                   (ulong)((uint)sVar19 & 0x7fffffff));
                          }
                          iVar10 = ferror(__stream);
                          fclose(__stream);
                          if (iVar10 != 0) {
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&txin_1,"Error reading file ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&newVersion);
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          RegisterSetJson((string *)&txid,(string *)&vStrInputParts);
                          std::__cxx11::string::~string((string *)&vStrInputParts);
                          std::__cxx11::string::~string((string *)&newVersion);
                          goto LAB_001123d6;
                        }
                        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar26,"Register load requires NAME:FILENAME");
                      }
                      else {
                        bVar7 = std::operator==(command,"set");
                        if (bVar7) {
                          sVar14 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   ::find(commandVal,':',0);
                          if ((1 < sVar14 + 1) && (sVar14 != commandVal->_M_string_length - 1)) {
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&txin_1,commandVal,0,sVar14);
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&txid,commandVal,sVar14 + 1,0xffffffffffffffff);
                            RegisterSetJson((string *)&txin_1,(string *)&txid);
                            std::__cxx11::string::~string((string *)&txid);
                            pCVar28 = &txin_1;
                            goto LAB_001123de;
                          }
                          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar26,"Register input requires NAME:VALUE");
                        }
                        else {
                          prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(prVar26,"unknown command");
                        }
                      }
LAB_001139fd:
                      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                        __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_00115073;
                    }
                    vStrInputParts_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    sVar15 = 0;
                    sVar14 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       (commandVal,':',0);
                    if (sVar14 != 0xffffffffffffffff) {
                      if (sVar14 == 0) {
                        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar26,"TX output value not specified");
                        goto LAB_001139fd;
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&txin_1,commandVal,0,sVar14);
                      vStrInputParts_1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)ExtractAndValidateValue((string *)&txin_1);
                      std::__cxx11::string::~string((string *)&txin_1);
                      sVar15 = sVar14 + 1;
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &txid,commandVal,sVar15,0xffffffffffffffff);
                    str_05._M_str._1_7_ =
                         txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                         _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                         _M_payload._1_7_;
                    str_05._M_str._0_1_ =
                         txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                         _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                         _M_payload._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
                    str_05._M_len =
                         txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                         _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                         _M_payload._8_8_;
                    bVar7 = IsHex(str_05);
                    if (!bVar7) {
                      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar26,"invalid TX output data");
                      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                        __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_00115073;
                    }
                    hex_str_01._M_str._1_7_ =
                         txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                         _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                         _M_payload._1_7_;
                    hex_str_01._M_str._0_1_ =
                         txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                         _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                         _M_payload._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
                    hex_str_01._M_len =
                         txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                         _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                         _M_payload._8_8_;
                    ParseHex<unsigned_char>
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vout,
                               hex_str_01);
                    vStrInputParts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    vStrInputParts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    vStrInputParts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    pCVar17 = CScript::operator<<((CScript *)&vStrInputParts,OP_RETURN);
                    other = &CScript::operator<<(pCVar17,(
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&vout)->super_CScriptBase;
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion,other
                              );
                    scriptPubKeyIn_01.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffea80;
                    scriptPubKeyIn_01.super_CScriptBase._union.indirect_contents.indirect =
                         (char *)in_stack_ffffffffffffea78;
                    scriptPubKeyIn_01.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffea88;
                    scriptPubKeyIn_01.super_CScriptBase._24_8_ = in_stack_ffffffffffffea90;
                    CTxOut::CTxOut((CTxOut *)&txin_1,(CAmount *)&vStrInputParts_1,scriptPubKeyIn_01)
                    ;
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts);
                    std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                              (&tx->vout,(value_type *)&txin_1);
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               ((long)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
                                      _M_elems + 8));
                    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&vout)
                    ;
LAB_001123d6:
                    pCVar28 = (CTxIn *)&txid;
LAB_001123de:
                    std::__cxx11::string::~string((string *)pCVar28);
                    goto LAB_001116ee;
                  }
                  str_10._M_str = (char *)0x3a;
                  str_10._M_len = (size_t)(commandVal->_M_dataplus)._M_p;
                  util::SplitString_abi_cxx11_
                            (&vStrInputParts_1,(util *)commandVal->_M_string_length,str_10,
                             (char)in_R8);
                  if ((ulong)((long)vStrInputParts_1.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)vStrInputParts_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar26,"TX output missing separator");
                    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                      __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_00115073;
                  }
                  value = ExtractAndValidateValue
                                    (vStrInputParts_1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                  std::__cxx11::string::string
                            ((string *)&txid,
                             vStrInputParts_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
                  ParseScript((CScript *)&newVersion,(string *)&txid);
                  if ((long)vStrInputParts_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vStrInputParts_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
                    std::__cxx11::string::string
                              ((string *)&txin_1,
                               vStrInputParts_1.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + -1);
                    sVar14 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&txin_1,'W',0);
                    sVar15 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&txin_1,'S',0);
                    std::__cxx11::string::~string((string *)&txin_1);
                    if ((uint)local_1288._12_4_ < 0x272e) {
                      if (sVar14 == 0xffffffffffffffff) {
                        if (sVar15 != 0xffffffffffffffff) goto LAB_00112849;
                      }
                      else {
                        WitnessV0ScriptHash::WitnessV0ScriptHash
                                  ((WitnessV0ScriptHash *)&vout,(CScript *)&newVersion);
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                             local_1348[0];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                             local_1348[1];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                             local_1348[2];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                             local_1348[3];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
                             local_1348[4];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
                             local_1348[5];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
                             local_1348[6];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
                             local_1348[7];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
                             local_1348[8];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
                             local_1348[9];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
                             local_1348[10];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
                             local_1348[0xb];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
                             local_1348[0xc];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
                             local_1348[0xd];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
                             local_1348[0xe];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
                             local_1348[0xf];
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
                             (undefined1)vout;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                             vout._1_1_;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                             vout._2_1_;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                             vout._3_1_;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
                             vout._4_1_;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
                             vout._5_1_;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
                             vout._6_1_;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
                             vout._7_1_;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                             uStack_1350;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                             uStack_134f;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                             uStack_134e;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                             uStack_134d;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                             uStack_134c;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                             uStack_134b;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                             uStack_134a;
                        txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                             uStack_1349;
                        txin_1.nSequence._0_1_ = 4;
                        GetScriptForDestination
                                  ((CScript *)&vStrInputParts,(CTxDestination *)&txin_1);
                        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion,
                                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                   &vStrInputParts);
                        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                   &vStrInputParts);
                        std::__detail::__variant::
                        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                             *)&txin_1);
                        if (sVar15 != 0xffffffffffffffff) {
LAB_00112849:
                          if (0x225 < (uint)local_1288._12_4_) {
                            prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                            uVar4 = local_1288._12_4_ - 0x1d;
                            if ((uint)local_1288._12_4_ < 0x1d) {
                              uVar4 = local_1288._12_4_;
                            }
                            vStrInputParts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT44(vStrInputParts.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  uVar4);
                            tinyformat::format<unsigned_int,unsigned_int>
                                      ((string *)&txin_1,
                                       (tinyformat *)"redeemScript exceeds size limit: %d > %d",
                                       (char *)&vStrInputParts,&MAX_SCRIPT_ELEMENT_SIZE,in_R8);
                            std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                              __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            goto LAB_00115073;
                          }
                          ScriptHash::ScriptHash((ScriptHash *)&vout,(CScript *)&newVersion);
                          uVar5 = local_1348._0_8_;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]
                               = local_1348[0];
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]
                               = local_1348[1];
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]
                               = local_1348[2];
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]
                               = local_1348[3];
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
                               (undefined1)vout;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
                               vout._1_1_;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
                               vout._2_1_;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
                               vout._3_1_;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
                               vout._4_1_;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
                               vout._5_1_;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
                               vout._6_1_;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
                               vout._7_1_;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
                               uStack_1350;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
                               uStack_134f;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
                               uStack_134e;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
                               uStack_134d;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
                               uStack_134c;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
                               uStack_134b;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
                               uStack_134a;
                          txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
                               uStack_1349;
                          txin_1.nSequence._0_1_ = 3;
                          local_1348._0_8_ = uVar5;
                          GetScriptForDestination
                                    ((CScript *)&vStrInputParts,(CTxDestination *)&txin_1);
                          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion
                                     ,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                      &vStrInputParts);
                          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                     &vStrInputParts);
                          std::__detail::__variant::
                          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                               *)&txin_1);
                        }
                      }
LAB_001128c4:
                      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts
                                 ,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                      scriptPubKeyIn_03.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffea80;
                      scriptPubKeyIn_03.super_CScriptBase._union.indirect_contents.indirect =
                           (char *)in_stack_ffffffffffffea78;
                      scriptPubKeyIn_03.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffea88;
                      scriptPubKeyIn_03.super_CScriptBase._24_8_ = in_stack_ffffffffffffea90;
                      CTxOut::CTxOut((CTxOut *)&txin_1,&value,scriptPubKeyIn_03);
                      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&vStrInputParts
                                );
                      std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                                (&tx->vout,(value_type *)&txin_1);
                      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                 ((long)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 8));
                      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                      this = (string *)&txid;
                      goto LAB_00111b19;
                    }
                  }
                  else if ((uint)local_1288._12_4_ < 0x272e) goto LAB_001128c4;
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  uVar4 = local_1288._12_4_ - 0x1d;
                  if ((uint)local_1288._12_4_ < 0x1d) {
                    uVar4 = local_1288._12_4_;
                  }
                  vStrInputParts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(vStrInputParts.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
                  tinyformat::format<unsigned_int,int>
                            ((string *)&txin_1,(tinyformat *)"script exceeds size limit: %d > %d",
                             (char *)&vStrInputParts,&MAX_SCRIPT_SIZE,(int *)in_R8);
                  std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_00115073;
                }
                pEVar13 = (ECC_Context *)operator_new(1);
                ECC_Context::ECC_Context(pEVar13);
                std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
                          ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)&ecc,
                           pEVar13);
                str_09._M_str = (char *)0x3a;
                str_09._M_len = (size_t)(commandVal->_M_dataplus)._M_p;
                util::SplitString_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&value,(util *)commandVal->_M_string_length,str_09,(char)in_R8);
                if ((ulong)((long)local_14e8 - value) < 0x41) {
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar26,"Not enough multisig parameters");
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_00115073;
                }
                txv.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)ExtractAndValidateValue((string *)value)
                ;
                pvVar12 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&value,1);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&txin_1,"invalid multisig required number",
                           (allocator<char> *)&txid);
                uVar8 = TrimAndParse<unsigned_int>(pvVar12,(string *)&txin_1);
                std::__cxx11::string::~string((string *)&txin_1);
                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = (char)uVar8;
                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = (char)(uVar8 >> 8);
                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = (char)(uVar8 >> 0x10);
                out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = (char)(uVar8 >> 0x18);
                pvVar12 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&value,2);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&txin_1,"invalid multisig total number",
                           (allocator<char> *)&txid);
                uVar9 = TrimAndParse<unsigned_int>(pvVar12,(string *)&txin_1);
                std::__cxx11::string::~string((string *)&txin_1);
                txid_1.super__Optional_base<transaction_identifier<false>,_true,_true>._M_payload.
                super__Optional_payload_base<transaction_identifier<false>_>._M_payload._0_4_ =
                     uVar9;
                if ((ulong)((long)local_14e8 - value >> 5) < (ulong)(uVar9 + 3)) {
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar26,"incorrect number of multisig pubkeys");
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_00115073;
                }
                if (((uVar9 < uVar8) || (uVar8 - 0x15 < 0xffffffec)) || (uVar9 - 0x15 < 0xffffffec))
                {
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  util::ToString<unsigned_int>((string *)&vout,(uint *)&out);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vStrInputParts,"multisig parameter mismatch. Required ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vout);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&newVersion,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vStrInputParts," of ");
                  util::ToString<unsigned_int>((string *)&vStrInputParts_1,(uint *)&txid_1);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&txid,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&newVersion,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vStrInputParts_1);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&txin_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&txid,"signatures.");
                  std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_00115073;
                }
                vout = 0;
                _uStack_1350 = (byte *)0x0;
                local_1348._0_8_ = 0;
                for (lVar31 = 0; (ulong)uVar9 << 5 != lVar31; lVar31 = lVar31 + 0x20) {
                  hex_str_00._M_str = *(char **)(value + 0x60 + lVar31);
                  hex_str_00._M_len = *(size_t *)(value + 0x68 + lVar31);
                  ParseHex<unsigned_char>
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txid,
                             hex_str_00);
                  CPubKey::Set<unsigned_char_const*>
                            ((CPubKey *)&txin_1,
                             (uchar *)CONCAT71(txid.
                                               super__Optional_base<transaction_identifier<false>,_true,_true>
                                               ._M_payload.
                                               super__Optional_payload_base<transaction_identifier<false>_>
                                               ._M_payload._1_7_,
                                               txid.
                                               super__Optional_base<transaction_identifier<false>,_true,_true>
                                               ._M_payload.
                                               super__Optional_payload_base<transaction_identifier<false>_>
                                               ._M_payload._M_value.m_wrapped.super_base_blob<256U>.
                                               m_data._M_elems[0]),
                             (uchar *)txid.
                                      super__Optional_base<transaction_identifier<false>,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<transaction_identifier<false>_>.
                                      _M_payload._8_8_);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txid);
                  bVar7 = CPubKey::IsFullyValid((CPubKey *)&txin_1);
                  if (!bVar7) {
                    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar26,"invalid TX output pubkey");
                    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                      __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_00115073;
                  }
                  std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
                            ((vector<CPubKey,_std::allocator<CPubKey>_> *)&vout,
                             (value_type *)&txin_1);
                }
                uVar16 = (long)local_14e8 - value >> 5;
                if (uVar16 == uVar9 + 4) {
                  std::__cxx11::string::string
                            ((string *)&txin_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_14e8[-1].nSequence);
                  sVar14 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&txin_1,'W',0);
                  bVar7 = sVar14 != 0xffffffffffffffff;
                  sVar14 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&txin_1,'S',0);
                  bVar33 = sVar14 != 0xffffffffffffffff;
                  std::__cxx11::string::~string((string *)&txin_1);
                }
                else {
                  if (uVar9 + 4 < uVar16) {
                    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar26,"Too many parameters");
                    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                      __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_00115073;
                  }
                  bVar7 = false;
                  bVar33 = false;
                }
                GetScriptForMultisig
                          ((CScript *)&txid,uVar8,(vector<CPubKey,_std::allocator<CPubKey>_> *)&vout
                          );
                pbVar18 = (byte *)vout;
                if (bVar7) {
                  do {
                    if (pbVar18 == (byte *)_uStack_1350) {
                      WitnessV0ScriptHash::WitnessV0ScriptHash
                                ((WitnessV0ScriptHash *)&vStrInputParts,(CScript *)&txid);
                      txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
                           vStrInputParts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
                           aaStack_12e0[0]._0_8_;
                      txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                           vStrInputParts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
                           vStrInputParts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      txin_1.nSequence._0_1_ = 4;
                      GetScriptForDestination((CScript *)&newVersion,(CTxDestination *)&txin_1);
                      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txid,
                                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                      std::__detail::__variant::
                      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                           *)&txin_1);
                      goto LAB_001124f6;
                    }
                    bVar1 = *pbVar18;
                    pbVar18 = pbVar18 + 0x41;
                  } while ((bVar1 & 0xfe) == 2);
                  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar26,"Uncompressed pubkeys are not useable for SegWit outputs");
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_00115073;
                }
LAB_001124f6:
                if (bVar33) {
                  if (0x225 < (uint)txid.
                                    super__Optional_base<transaction_identifier<false>,_true,_true>.
                                    _M_payload.
                                    super__Optional_payload_base<transaction_identifier<false>_>.
                                    _M_payload._28_4_) {
                    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
                    uVar4 = txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                            _M_payload.super__Optional_payload_base<transaction_identifier<false>_>.
                            _M_payload._28_4_ + -0x1d;
                    if ((uint)txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                              _M_payload.
                              super__Optional_payload_base<transaction_identifier<false>_>.
                              _M_payload._28_4_ < 0x1d) {
                      uVar4 = txid.super__Optional_base<transaction_identifier<false>,_true,_true>.
                              _M_payload.
                              super__Optional_payload_base<transaction_identifier<false>_>.
                              _M_payload._28_4_;
                    }
                    newVersion = uVar4;
                    tinyformat::format<unsigned_int,unsigned_int>
                              ((string *)&txin_1,
                               (tinyformat *)"redeemScript exceeds size limit: %d > %d",
                               (char *)&newVersion,&MAX_SCRIPT_ELEMENT_SIZE,in_R8);
                    std::runtime_error::runtime_error(prVar26,(string *)&txin_1);
                    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                      __cxa_throw(prVar26,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    goto LAB_00115073;
                  }
                  ScriptHash::ScriptHash((ScriptHash *)&vStrInputParts,(CScript *)&txid);
                  pbVar6 = vStrInputParts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
                       vStrInputParts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
                  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
                       vStrInputParts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_;
                  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
                       vStrInputParts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_;
                  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
                       vStrInputParts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_;
                  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                       vStrInputParts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
                       vStrInputParts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  txin_1.nSequence._0_1_ = 3;
                  vStrInputParts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar6;
                  GetScriptForDestination((CScript *)&newVersion,(CTxDestination *)&txin_1);
                  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txid,
                             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                  std::__detail::__variant::
                  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                       *)&txin_1);
                }
                prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion,
                           (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txid);
                scriptPubKeyIn_02.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffea80;
                scriptPubKeyIn_02.super_CScriptBase._union.indirect_contents.indirect =
                     (char *)in_stack_ffffffffffffea78;
                scriptPubKeyIn_02.super_CScriptBase._union._16_8_ = in_stack_ffffffffffffea88;
                scriptPubKeyIn_02.super_CScriptBase._24_8_ = in_stack_ffffffffffffea90;
                CTxOut::CTxOut((CTxOut *)&txin_1,(CAmount *)&txv,scriptPubKeyIn_02);
                prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newVersion);
                std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                          (&tx->vout,(value_type *)&txin_1);
                prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           ((long)txin_1.prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
                                  _M_elems + 8));
                prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txid);
                std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
                          ((_Vector_base<CPubKey,_std::allocator<CPubKey>_> *)&vout);
                this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&value;
              }
            }
LAB_00111b97:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(this_00);
          }
        }
      }
    }
  }
LAB_001116ee:
  std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr(&ecc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00115073:
  __stack_chk_fail();
}

Assistant:

static void MutateTx(CMutableTransaction& tx, const std::string& command,
                     const std::string& commandVal)
{
    std::unique_ptr<ECC_Context> ecc;

    if (command == "nversion")
        MutateTxVersion(tx, commandVal);
    else if (command == "locktime")
        MutateTxLocktime(tx, commandVal);
    else if (command == "replaceable") {
        MutateTxRBFOptIn(tx, commandVal);
    }

    else if (command == "delin")
        MutateTxDelInput(tx, commandVal);
    else if (command == "in")
        MutateTxAddInput(tx, commandVal);

    else if (command == "delout")
        MutateTxDelOutput(tx, commandVal);
    else if (command == "outaddr")
        MutateTxAddOutAddr(tx, commandVal);
    else if (command == "outpubkey") {
        ecc.reset(new ECC_Context());
        MutateTxAddOutPubKey(tx, commandVal);
    } else if (command == "outmultisig") {
        ecc.reset(new ECC_Context());
        MutateTxAddOutMultiSig(tx, commandVal);
    } else if (command == "outscript")
        MutateTxAddOutScript(tx, commandVal);
    else if (command == "outdata")
        MutateTxAddOutData(tx, commandVal);

    else if (command == "sign") {
        ecc.reset(new ECC_Context());
        MutateTxSign(tx, commandVal);
    }

    else if (command == "load")
        RegisterLoad(commandVal);

    else if (command == "set")
        RegisterSet(commandVal);

    else
        throw std::runtime_error("unknown command");
}